

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O3

vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
* __thiscall
tinyusdz::lerp<std::array<tinyusdz::value::half,4ul>>
          (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
           *__return_storage_ptr__,tinyusdz *this,
          vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
          *a,vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
             *b,double t)

{
  pointer paVar1;
  ulong uVar2;
  half4 hVar3;
  long lVar4;
  ulong __new_size;
  half4 local_40;
  half4 local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = *(long *)(this + 8) - *(long *)this >> 3;
  __new_size = (long)(a->
                     super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(a->
                     super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar2 <= __new_size) {
    __new_size = uVar2;
  }
  if (__new_size != 0) {
    ::std::
    vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
    ::resize(__return_storage_ptr__,__new_size);
    if (*(long *)(this + 8) - *(long *)this ==
        (long)(a->
              super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      lVar4 = 0;
      do {
        paVar1 = (a->
                 super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_38 = operator*((float)(1.0 - t),(half4 *)(*(long *)this + lVar4));
        local_40 = operator*((float)t,(half4 *)((long)&paVar1->_M_elems[0].value + lVar4));
        hVar3 = operator+(&local_38,&local_40);
        *(_Type *)((long)&((__return_storage_ptr__->
                           super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].value + lVar4) =
             hVar3._M_elems;
        lVar4 = lVar4 + 8;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}